

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O2

int32_t MsgHelper::resolvAddr(S5AddrInfo *info,uint8_t *data)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t i;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = *data;
  pcVar3 = info->ADDR;
  memset(pcVar3,0,0x100);
  if (uVar1 == '\x04') {
    pcVar3 = inet_ntop(10,data + 1,pcVar3,0x100);
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    uVar5 = 0x11;
  }
  else if (uVar1 == '\x03') {
    bVar2 = data[1];
    for (uVar4 = 0; bVar2 != uVar4; uVar4 = uVar4 + 1) {
      pcVar3[uVar4] = data[uVar4 + 2];
    }
    uVar5 = bVar2 + 2;
  }
  else {
    if (uVar1 != '\x01') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                    ,0x196,"static int32_t MsgHelper::resolvAddr(S5AddrInfo *, uint8_t *)");
    }
    pcVar3 = inet_ntop(2,data + 1,pcVar3,0x100);
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    uVar5 = 5;
  }
  info->ATYP = uVar1;
  info->PORT = *(ushort *)(data + uVar5) << 8 | *(ushort *)(data + uVar5) >> 8;
  return uVar5 + 2;
}

Assistant:

int32_t MsgHelper::resolvAddr(S5AddrInfo* info, uint8_t* data)
{
	uint8_t ATYP = data[0];
	uint32_t ADDR_LEN = 0;

	memset(info->ADDR, 0, sizeof(info->ADDR));
	// ipv4
	if (ATYP == SOKS5_ATYP_IPV4)
	{
		ADDR_LEN = 4;
		if(NULL == ::inet_ntop(AF_INET, data + 1, info->ADDR, sizeof(info->ADDR)))
			return 0;
	}
	// domain name
	else if (ATYP == SOKS5_ATYP_DOMAIN)
	{
		uint8_t addrLen = (uint8_t)data[1];
		for (uint8_t i = 0; i < addrLen; ++i)
		{
			info->ADDR[i] = data[2 + i];
		}

		ADDR_LEN = addrLen;
		ADDR_LEN ++;
	}
	// ipv6
	else if (ATYP == SOKS5_ATYP_IPV6)
	{
		ADDR_LEN = 16;
		if(NULL == ::inet_ntop(AF_INET6, data + 1, info->ADDR, sizeof(info->ADDR)))
			return 0;
	}
	else
	{
		assert(0);
		return 0;
	}
	info->ATYP = ATYP;
	info->PORT = ::htons(*((uint16_t*)&data[ADDR_LEN + 1]));

	return ADDR_LEN + 1 + 2;
}